

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void SerializeTransaction<ParamsStream<HashWriter&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<HashWriter_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  byte bVar1;
  long lVar2;
  size_type sVar3;
  byte *in_RDX;
  ParamsStream<HashWriter_&,_TransactionSerParams> *in_RSI;
  long in_FS_OFFSET;
  size_t i;
  bool fAllowWitness;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  uchar flags;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff78;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff80;
  ParamsStream<HashWriter_&,_TransactionSerParams> *in_stack_ffffffffffffff88;
  CMutableTransaction *in_stack_ffffffffffffff90;
  ulong uVar4;
  ulong local_60;
  bool local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *in_RDX;
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            (in_stack_ffffffffffffff88,(uint *)in_stack_ffffffffffffff80);
  local_9 = false;
  if ((bVar1 & 1) != 0) {
    local_9 = CMutableTransaction::HasWitness(in_stack_ffffffffffffff90);
  }
  if (local_9 != false) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(in_stack_ffffffffffffff78);
    ParamsStream<HashWriter&,TransactionSerParams>::operator<<
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    ParamsStream<HashWriter&,TransactionSerParams>::operator<<
              (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff88);
  }
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            (in_stack_ffffffffffffff88,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff80);
  if (local_9 != false) {
    local_60 = 0;
    while (uVar4 = local_60,
          sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size(in_stack_ffffffffffffff78),
          uVar4 < sVar3) {
      in_stack_ffffffffffffff88 = in_RSI;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RSI,
                 (size_type)in_stack_ffffffffffffff80);
      ParamsStream<HashWriter&,TransactionSerParams>::operator<<
                (in_stack_ffffffffffffff88,
                 (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffff80);
      local_60 = local_60 + 1;
    }
  }
  ParamsStream<HashWriter&,TransactionSerParams>::operator<<
            (in_stack_ffffffffffffff88,(uint *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}